

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O0

void psh_globals_set_scale
               (PSH_Globals globals,FT_Fixed x_scale,FT_Fixed y_scale,FT_Fixed x_delta,
               FT_Fixed y_delta)

{
  PSH_Dimension dim;
  FT_Fixed y_delta_local;
  FT_Fixed x_delta_local;
  FT_Fixed y_scale_local;
  FT_Fixed x_scale_local;
  PSH_Globals globals_local;
  
  if ((x_scale != globals->dimension[0].scale_mult) ||
     (x_delta != globals->dimension[0].scale_delta)) {
    globals->dimension[0].scale_mult = x_scale;
    globals->dimension[0].scale_delta = x_delta;
    psh_globals_scale_widths(globals,0);
  }
  if ((y_scale != globals->dimension[1].scale_mult) ||
     (y_delta != globals->dimension[1].scale_delta)) {
    globals->dimension[1].scale_mult = y_scale;
    globals->dimension[1].scale_delta = y_delta;
    psh_globals_scale_widths(globals,1);
    psh_blues_scale_zones(&globals->blues,y_scale,y_delta);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  psh_globals_set_scale( PSH_Globals  globals,
                         FT_Fixed     x_scale,
                         FT_Fixed     y_scale,
                         FT_Fixed     x_delta,
                         FT_Fixed     y_delta )
  {
    PSH_Dimension  dim;


    dim = &globals->dimension[0];
    if ( x_scale != dim->scale_mult  ||
         x_delta != dim->scale_delta )
    {
      dim->scale_mult  = x_scale;
      dim->scale_delta = x_delta;

      psh_globals_scale_widths( globals, 0 );
    }

    dim = &globals->dimension[1];
    if ( y_scale != dim->scale_mult  ||
         y_delta != dim->scale_delta )
    {
      dim->scale_mult  = y_scale;
      dim->scale_delta = y_delta;

      psh_globals_scale_widths( globals, 1 );
      psh_blues_scale_zones( &globals->blues, y_scale, y_delta );
    }
  }